

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O1

StringTree * capnp::operator*(StringTree *__return_storage_ptr__,int64_t param_2,uint16_t param_3)

{
  Reader local_50;
  
  local_50.type = ENUM;
  local_50.field_1.intValue = param_2;
  local_50.field_1.enumValue.value = param_3;
  anon_unknown_2::print(__return_storage_ptr__,&local_50,STRUCT,(Indent)0x0,BARE);
  DynamicValue::Reader::~Reader(&local_50);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree KJ_STRINGIFY(DynamicEnum value) { return stringify(value); }